

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InvisibleButton(char *str_id,ImVec2 *size_arg,ImGuiButtonFlags flags)

{
  bool bVar1;
  ImGuiID IVar2;
  ImGuiWindow *out_hovered;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  ImGuiWindowTempData *min;
  ImVec2 IVar3;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImVec2 size;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff88;
  ImVec2 in_stack_ffffffffffffffa0;
  float extra_flags;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  ImRect *bb_00;
  float flags_00;
  float fVar4;
  ImGuiContext *pIVar5;
  ImGuiID id_00;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  pIVar5 = GImGui;
  out_hovered = GetCurrentWindow();
  id_00 = (ImGuiID)((ulong)pIVar5 >> 0x20);
  if ((out_hovered->SkipItems & 1U) == 0) {
    IVar2 = ImGuiWindow::GetID((ImGuiWindow *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                               ,(char *)in_stack_ffffffffffffffa0);
    bb_00 = (ImRect *)*in_RSI;
    IVar3.y = in_stack_ffffffffffffffac;
    IVar3.x = in_stack_ffffffffffffffa8;
    IVar3 = CalcItemSize(IVar3,in_stack_ffffffffffffffa0.y,in_stack_ffffffffffffffa0.x);
    flags_00 = IVar3.x;
    fVar4 = IVar3.y;
    min = &out_hovered->DC;
    IVar3 = operator+(in_stack_ffffffffffffff88,(ImVec2 *)0x19ac99);
    extra_flags = IVar3.y;
    ImRect::ImRect((ImRect *)&stack0xffffffffffffffa8,&min->CursorPos,
                   (ImVec2 *)&stack0xffffffffffffffa0);
    ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac);
    bVar1 = ItemAdd(bb_00,(ImGuiID)in_stack_ffffffffffffffb4,
                    (ImRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (ImGuiItemFlags)extra_flags);
    if (bVar1) {
      local_1 = ButtonBehavior((ImRect *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),id_00,
                               (bool *)out_hovered,(bool *)CONCAT44(IVar2,fVar4),
                               (ImGuiButtonFlags)flags_00);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::InvisibleButton(const char* str_id, const ImVec2& size_arg, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    // Cannot use zero-size for InvisibleButton(). Unlike Button() there is not way to fallback using the label size.
    IM_ASSERT(size_arg.x != 0.0f && size_arg.y != 0.0f);

    const ImGuiID id = window->GetID(str_id);
    ImVec2 size = CalcItemSize(size_arg, 0.0f, 0.0f);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(size);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, str_id, g.LastItemData.StatusFlags);
    return pressed;
}